

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

void __thiscall
icu_63::Locale::getUnicodeKeywordValue
          (Locale *this,StringPiece keywordName,ByteSink *sink,UErrorCode *status)

{
  char *pcVar1;
  size_t sVar2;
  StringPiece keywordName_00;
  CharStringByteSink sink_1;
  CharString legacy_value;
  CharString keywordName_nul;
  CharStringByteSink local_c0;
  undefined1 local_b0 [12];
  CharString local_a0;
  CharString local_60;
  
  CharString::CharString(&local_60,keywordName,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar1 = uloc_toLegacyKey_63(local_60.buffer.ptr);
    if (pcVar1 == (char *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      MaybeStackArray<char,_40>::MaybeStackArray(&local_a0.buffer);
      local_a0.len = 0;
      *local_a0.buffer.ptr = '\0';
      CharStringByteSink::CharStringByteSink(&local_c0,&local_a0);
      StringPiece::StringPiece((StringPiece *)local_b0,pcVar1);
      keywordName_00._12_4_ = 0;
      keywordName_00.ptr_ = (char *)local_b0._0_8_;
      keywordName_00.length_ = local_b0._8_4_;
      getKeywordValue(this,keywordName_00,&local_c0.super_ByteSink,status);
      CharStringByteSink::~CharStringByteSink(&local_c0);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar1 = uloc_toUnicodeLocaleType_63(local_60.buffer.ptr,local_a0.buffer.ptr);
        if (pcVar1 == (char *)0x0) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          sVar2 = strlen(pcVar1);
          (*sink->_vptr_ByteSink[2])(sink,pcVar1,sVar2 & 0xffffffff);
        }
      }
      MaybeStackArray<char,_40>::~MaybeStackArray(&local_a0.buffer);
    }
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_60.buffer);
  return;
}

Assistant:

void
Locale::getUnicodeKeywordValue(StringPiece keywordName,
                               ByteSink& sink,
                               UErrorCode& status) const {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    if (U_FAILURE(status)) {
        return;
    }

    const char* legacy_key = uloc_toLegacyKey(keywordName_nul.data());

    if (legacy_key == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    CharString legacy_value;
    {
        CharStringByteSink sink(&legacy_value);
        getKeywordValue(legacy_key, sink, status);
    }

    if (U_FAILURE(status)) {
        return;
    }

    const char* unicode_value = uloc_toUnicodeLocaleType(
            keywordName_nul.data(), legacy_value.data());

    if (unicode_value == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    sink.Append(unicode_value, static_cast<int32_t>(uprv_strlen(unicode_value)));
}